

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenChain.h
# Opt level: O3

void __thiscall
adios2::shm::TokenChain<unsigned_long>::TokenChain(TokenChain<unsigned_long> *this,Comm *comm)

{
  Win *this_00;
  char *pcVar1;
  int iVar2;
  size_t shmsize;
  char *ptr;
  int disp_unit;
  Comm local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  int local_24;
  
  this->m_NodeComm = comm;
  iVar2 = helper::Comm::Rank(comm);
  this->m_Rank = iVar2;
  iVar2 = helper::Comm::Size(comm);
  this->m_nProc = iVar2;
  this_00 = &this->m_Win;
  helper::Comm::Win::Win(this_00);
  if (this->m_nProc < 2) {
    local_50._0_8_ = operator_new(0x10);
    this->m_Shm = (segment_ *)local_50._0_8_;
    goto LAB_004849f9;
  }
  if (this->m_Rank == 0) {
    local_40._M_allocated_capacity = 0;
    local_40._M_local_buf[8] = '\0';
    local_50._8_8_ = local_40._M_local_buf + 8;
    helper::Comm::Win_allocate_shared
              (&local_58,(size_t)this->m_NodeComm,0x10,(void *)0x1,(string *)local_50);
    helper::Comm::Win::operator=(this_00,(Win *)&local_58);
    helper::Comm::Win::~Win((Win *)&local_58);
    if ((char *)local_50._8_8_ != local_40._M_local_buf + 8) goto LAB_004849d4;
  }
  else {
    pcVar1 = local_40._M_local_buf + 8;
    local_40._M_allocated_capacity = 0;
    local_40._M_local_buf[8] = '\0';
    local_50._8_8_ = pcVar1;
    helper::Comm::Win_allocate_shared
              (&local_58,(size_t)this->m_NodeComm,0,(void *)0x1,(string *)local_50);
    helper::Comm::Win::operator=(this_00,(Win *)&local_58);
    helper::Comm::Win::~Win((Win *)&local_58);
    if ((char *)local_50._8_8_ != pcVar1) {
      operator_delete((void *)local_50._8_8_);
    }
    local_40._M_allocated_capacity = 0;
    local_40._M_local_buf[8] = '\0';
    local_50._8_8_ = pcVar1;
    helper::Comm::Win_shared_query
              (this->m_NodeComm,this_00,0,(size_t *)&local_58,&local_24,local_50,
               (string *)(local_50 + 8));
    if ((char *)local_50._8_8_ != pcVar1) {
LAB_004849d4:
      operator_delete((void *)local_50._8_8_);
    }
  }
  this->m_Shm = (segment_ *)local_50._0_8_;
  if (this->m_Rank != 0) {
    return;
  }
LAB_004849f9:
  ((segment_ *)local_50._0_8_)->currentRank = 0;
  ((segment_ *)local_50._0_8_)->token = 0;
  return;
}

Assistant:

TokenChain(helper::Comm *comm) : m_NodeComm(comm), m_Rank(comm->Rank()), m_nProc(comm->Size())
    {
        if (m_nProc > 1)
        {
            char *ptr;
            if (!m_Rank)
            {
                m_Win = m_NodeComm->Win_allocate_shared(sizeof(segment_), 1, &ptr);
            }
            else
            {
                m_Win = m_NodeComm->Win_allocate_shared(0, 1, &ptr);
                size_t shmsize;
                int disp_unit;
                m_NodeComm->Win_shared_query(m_Win, 0, &shmsize, &disp_unit, &ptr);
            }
            m_Shm = reinterpret_cast<segment_ *>(ptr);

            if (!m_Rank)
            {
                m_Shm->currentRank = 0;
                m_Shm->token = T();
            }
        }
        else
        {
            m_Shm = new segment_;
            m_Shm->currentRank = 0;
            m_Shm->token = T();
        }
    }